

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

void cff_subfont_done(FT_Memory memory,CFF_SubFont subfont)

{
  CFF_SubFont subfont_local;
  FT_Memory memory_local;
  
  if (subfont != (CFF_SubFont)0x0) {
    cff_index_done(&subfont->local_subrs_index);
    ft_mem_free(memory,subfont->local_subrs);
    subfont->local_subrs = (FT_Byte **)0x0;
    ft_mem_free(memory,(subfont->blend).lastNDV);
    (subfont->blend).lastNDV = (FT_Fixed *)0x0;
    ft_mem_free(memory,(subfont->blend).BV);
    (subfont->blend).BV = (FT_Int32 *)0x0;
    ft_mem_free(memory,subfont->blend_stack);
    subfont->blend_stack = (FT_Byte *)0x0;
  }
  return;
}

Assistant:

static void
  cff_subfont_done( FT_Memory    memory,
                    CFF_SubFont  subfont )
  {
    if ( subfont )
    {
      cff_index_done( &subfont->local_subrs_index );
      FT_FREE( subfont->local_subrs );

      FT_FREE( subfont->blend.lastNDV );
      FT_FREE( subfont->blend.BV );
      FT_FREE( subfont->blend_stack );
    }
  }